

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall application::application(application *this)

{
  _Rb_tree_header *p_Var1;
  io_service *this_00;
  atomic_count *paVar2;
  service_type *psVar3;
  signal_op *psVar4;
  signal_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Stazer[P]autonomouscabs_backend_application_cpp:21:25),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *op;
  registration *prVar5;
  signal_op *psVar6;
  undefined8 uVar7;
  long in_FS_OFFSET;
  undefined1 local_68 [16];
  signal_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Stazer[P]autonomouscabs_backend_application_cpp:21:25),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *psStack_58;
  size_t local_50;
  anon_class_8_1_8991fb9c_for_handler_ local_48;
  undefined1 local_40 [16];
  
  memset(this,0,0xa8);
  (this->_cab_manager)._cabs._M_h._M_buckets = &(this->_cab_manager)._cabs._M_h._M_single_bucket;
  (this->_cab_manager)._cabs._M_h._M_bucket_count = 1;
  (this->_cab_manager)._cabs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_cab_manager)._cabs._M_h._M_element_count = 0;
  (this->_cab_manager)._cabs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  p_Var1 = &(this->_cab_manager)._cabs_at_node._M_t._M_impl.super__Rb_tree_header;
  (this->_cab_manager)._cabs_at_node._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_cab_manager)._cabs_at_node._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->_cab_manager)._cabs._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_cab_manager)._cabs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->_cab_manager)._counter = 0;
  (this->_cab_manager)._cabs_at_node._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->_cab_manager)._cabs_at_node._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_cab_manager)._cabs_at_node._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  road_network::road_network(&(this->_cab_manager)._rnet);
  this_00 = &this->_io_service;
  boost::asio::io_context::io_context(this_00);
  (this->_cab_server)._M_t.super___uniq_ptr_impl<cab_server,_std::default_delete<cab_server>_>._M_t.
  super__Tuple_impl<0UL,_cab_server_*,_std::default_delete<cab_server>_>.
  super__Head_base<0UL,_cab_server_*,_false>._M_head_impl = (cab_server *)0x0;
  boost::asio::
  basic_signal_set<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_signal_set<boost::asio::io_context>(&this->_signals,this_00,2,(type *)0x0);
  local_68._0_8_ = (ulong)(uint)local_68._4_4_ << 0x20;
  boost::asio::posix::
  basic_descriptor<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_descriptor<boost::asio::io_context>
            (&(this->_command_descriptor).
              super_basic_descriptor<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
             ,this_00,(native_handle_type *)local_68,(type *)0x0);
  boost::asio::basic_streambuf<std::allocator<char>_>::basic_streambuf
            (&this->_command_buffer,0xffffffffffffffff,(allocator<char> *)local_68);
  local_68._0_8_ = local_40;
  psVar3 = (this->_signals).impl_.service_;
  if (*(long *)(in_FS_OFFSET + -8) == 0) {
    uVar7 = 0;
  }
  else {
    uVar7 = *(undefined8 *)(*(long *)(in_FS_OFFSET + -8) + 8);
  }
  local_40._0_8_ = this;
  op = (signal_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Stazer[P]autonomouscabs_backend_application_cpp:21:25),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
        *)boost::asio::detail::thread_info_base::
          allocate<boost::asio::detail::thread_info_base::default_tag>(uVar7,0x68);
  psStack_58 = (signal_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Stazer[P]autonomouscabs_backend_application_cpp:21:25),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)0x0;
  (op->super_signal_op).super_operation.next_ = (scheduler_operation *)0x0;
  (op->super_signal_op).super_operation.func_ =
       boost::asio::detail::
       signal_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/backend/application.cpp:21:25),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
       ::do_complete;
  (op->super_signal_op).super_operation.task_result_ = 0;
  (op->super_signal_op).ec_.val_ = 0;
  (op->super_signal_op).ec_.failed_ = false;
  (op->super_signal_op).ec_.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  (op->super_signal_op).signal_number_ = 0;
  (op->handler_).this = (application *)local_40._0_8_;
  local_68._8_8_ = op;
  boost::asio::detail::
  handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
  ::handler_work_base(&(op->work_).
                       super_handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
                      ,&(this->_signals).impl_.executor_);
  LOCK();
  paVar2 = &psVar3->scheduler_->outstanding_work_;
  (paVar2->super___atomic_base<long>)._M_i = (paVar2->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  psStack_58 = op;
  pthread_mutex_lock((pthread_mutex_t *)boost::asio::detail::get_signal_state()::state);
  prVar5 = (this->_signals).impl_.implementation_.signals_;
  do {
    if (prVar5 == (registration *)0x0) {
      (op->super_signal_op).super_operation.next_ = (scheduler_operation *)0x0;
      psVar4 = (this->_signals).impl_.implementation_.queue_.back_;
      psVar6 = (signal_op *)&(this->_signals).impl_.implementation_.queue_.back_;
      if (psVar4 != (signal_op *)0x0) {
        psVar6 = psVar4;
      }
      (psVar6->super_operation).next_ = (scheduler_operation *)op;
      (&(this->_signals).impl_.implementation_.queue_.front_)[psVar4 != (signal_op *)0x0] =
           (signal_op *)op;
LAB_0010b9a3:
      pthread_mutex_unlock((pthread_mutex_t *)boost::asio::detail::get_signal_state()::state);
      local_68._8_8_ =
           (signal_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Stazer[P]autonomouscabs_backend_application_cpp:21:25),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
            *)0x0;
      psStack_58 = (signal_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Stazer[P]autonomouscabs_backend_application_cpp:21:25),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                    *)0x0;
      boost::asio::detail::
      signal_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/backend/application.cpp:21:25),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
      ::ptr::reset((ptr *)local_68);
      psStack_58 = (signal_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Stazer[P]autonomouscabs_backend_application_cpp:21:25),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                    *)CONCAT71(psStack_58._1_7_,10);
      psStack_58 = (signal_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Stazer[P]autonomouscabs_backend_application_cpp:21:25),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                    *)((ulong)psStack_58 & 0xffffffff);
      local_50 = 0;
      local_40._0_8_ = local_40._0_8_ & 0xffffff0000000000;
      local_40._8_8_ = &boost::system::detail::cat_holder<void>::system_category_instance;
      local_68._0_8_ = &this->_command_descriptor;
      local_68._8_8_ = &this->_command_buffer;
      local_48.this = this;
      boost::asio::detail::
      read_until_delim_op_v1<boost::asio::posix::basic_stream_descriptor<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_boost::asio::basic_streambuf_ref<std::allocator<char>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/backend/application.cpp:72:79)>
      ::operator()((read_until_delim_op_v1<boost::asio::posix::basic_stream_descriptor<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_boost::asio::basic_streambuf_ref<std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Stazer[P]autonomouscabs_backend_application_cpp:72:79)>
                    *)local_68,(error_code *)local_40,0,1);
      return;
    }
    if (prVar5->undelivered_ != 0) {
      prVar5->undelivered_ = prVar5->undelivered_ - 1;
      (op->super_signal_op).signal_number_ = prVar5->signal_number_;
      boost::asio::detail::scheduler::post_deferred_completion(psVar3->scheduler_,(operation *)op);
      goto LAB_0010b9a3;
    }
    prVar5 = prVar5->next_in_set_;
  } while( true );
}

Assistant:

application::application():
    _cab_manager(),
    _io_service(),
    _cab_server(),
    _signals(_io_service, SIGINT),
    _command_descriptor(_io_service, STDIN_FILENO),
    _command_buffer()
{
    _signals.async_wait([this](const boost::system::error_code& error_code, int signal)
    {
        if(!error_code)
        {
            std::cout << "Received SIGINT\n";
            _io_service.stop();
        }
    });

    handle_command();
}